

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall perfetto::protos::gen::IPCFrame::IPCFrame(IPCFrame *this)

{
  pointer *__ptr_3;
  pointer *__ptr_1;
  pointer *__ptr;
  pointer *__ptr_2;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__IPCFrame_003a3950;
  this->request_id_ = 0;
  protozero::CopyablePtr<perfetto::protos::gen::IPCFrame_BindService>::CopyablePtr
            (&this->msg_bind_service_);
  protozero::CopyablePtr<perfetto::protos::gen::IPCFrame_BindServiceReply>::CopyablePtr
            (&this->msg_bind_service_reply_);
  protozero::CopyablePtr<perfetto::protos::gen::IPCFrame_InvokeMethod>::CopyablePtr
            (&this->msg_invoke_method_);
  protozero::CopyablePtr<perfetto::protos::gen::IPCFrame_InvokeMethodReply>::CopyablePtr
            (&this->msg_invoke_method_reply_);
  protozero::CopyablePtr<perfetto::protos::gen::IPCFrame_RequestError>::CopyablePtr
            (&this->msg_request_error_);
  (this->data_for_testing_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data_for_testing_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data_for_testing_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)&(this->unknown_fields_).field_2;
  (this->unknown_fields_)._M_string_length = 0;
  (this->unknown_fields_).field_2._M_local_buf[0] = '\0';
  (this->_has_field_).super__Base_bitset<1UL>._M_w = 0;
  return;
}

Assistant:

IPCFrame::IPCFrame() = default;